

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O0

void glu::readPixels(RenderContext *context,int x,int y,PixelBufferAccess *dst)

{
  code *pcVar1;
  int iVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  InternalError *pIVar7;
  TextureFormat *pTVar8;
  TransferFormat TVar9;
  void *pvVar10;
  deUint32 dStack_40;
  TransferFormat format;
  int height;
  int width;
  Functions *gl;
  PixelBufferAccess *dst_local;
  int y_local;
  int x_local;
  RenderContext *context_local;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) ||
       (iVar4 = tcu::ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess),
       iVar4 != 1)) {
      pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar7,(char *)0x0,"dst.getDepth() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
                 ,0x35);
      __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  while (dVar3 = ::deGetFalse(), dVar3 == 0) {
    iVar4 = tcu::ConstPixelBufferAccess::getRowPitch(&dst->super_ConstPixelBufferAccess);
    pTVar8 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
    iVar5 = tcu::TextureFormat::getPixelSize(pTVar8);
    iVar6 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
    if (iVar4 != iVar5 * iVar6) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      iVar4 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
      iVar5 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
      TVar9 = getTransferFormat(*pTVar8);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xff0);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
      iVar6 = getTransferAlignment(*pTVar8);
      (*pcVar1)(0xd05,iVar6);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1220);
      dStack_40 = TVar9.dataType;
      pvVar10 = tcu::PixelBufferAccess::getDataPtr(dst);
      (*pcVar1)(x,y,iVar4,iVar5,(ulong)TVar9 & 0xffffffff,dStack_40,pvVar10);
      return;
    }
  }
  pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar7,(char *)0x0,"dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
             ,0x36);
  __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void readPixels (const RenderContext& context, int x, int y, const tcu::PixelBufferAccess& dst)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	TCU_CHECK_INTERNAL(dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth());

	int				width		= dst.getWidth();
	int				height		= dst.getHeight();
	TransferFormat	format		= getTransferFormat(dst.getFormat());

	gl.pixelStorei(GL_PACK_ALIGNMENT, getTransferAlignment(dst.getFormat()));
	gl.readPixels(x, y, width, height, format.format, format.dataType, dst.getDataPtr());
}